

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O3

void __thiscall sing::Buffer::append(Buffer *this,string *str)

{
  pointer __src;
  size_t len;
  
  __src = (str->_M_dataplus)._M_p;
  len = str->_M_string_length;
  ensureWritableBytes(this,len);
  if (len != 0) {
    memmove((this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + this->writeIndex,__src,len);
  }
  this->writeIndex = this->writeIndex + len;
  return;
}

Assistant:

void append(const std::string& str){ 
        append(str.data(), str.length()); 
    }